

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

void tinyobj::InitMaterial(material_t *material)

{
  std::__cxx11::string::_M_replace
            ((ulong)material,0,(char *)(material->name)._M_string_length,0x18bfa2);
  std::__cxx11::string::_M_replace
            ((ulong)&material->ambient_texname,0,
             (char *)(material->ambient_texname)._M_string_length,0x18bfa2);
  std::__cxx11::string::_M_replace
            ((ulong)&material->diffuse_texname,0,
             (char *)(material->diffuse_texname)._M_string_length,0x18bfa2);
  std::__cxx11::string::_M_replace
            ((ulong)&material->specular_texname,0,
             (char *)(material->specular_texname)._M_string_length,0x18bfa2);
  std::__cxx11::string::_M_replace
            ((ulong)&material->specular_highlight_texname,0,
             (char *)(material->specular_highlight_texname)._M_string_length,0x18bfa2);
  std::__cxx11::string::_M_replace
            ((ulong)&material->bump_texname,0,(char *)(material->bump_texname)._M_string_length,
             0x18bfa2);
  std::__cxx11::string::_M_replace
            ((ulong)&material->displacement_texname,0,
             (char *)(material->displacement_texname)._M_string_length,0x18bfa2);
  std::__cxx11::string::_M_replace
            ((ulong)&material->alpha_texname,0,(char *)(material->alpha_texname)._M_string_length,
             0x18bfa2);
  material->ambient[0] = 0.0;
  material->ambient[1] = 0.0;
  *(undefined8 *)(material->ambient + 2) = 0;
  material->diffuse[1] = 0.0;
  material->diffuse[2] = 0.0;
  material->specular[0] = 0.0;
  material->specular[1] = 0.0;
  *(undefined8 *)(material->specular + 2) = 0;
  material->transmittance[1] = 0.0;
  material->transmittance[2] = 0.0;
  *(undefined8 *)(material->transmittance + 2) = 0;
  material->emission[1] = 0.0;
  material->emission[2] = 0.0;
  material->dissolve = 1.0;
  material->illum = 0;
  material->shininess = 1.0;
  material->ior = 1.0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(material->unknown_parameter)._M_t);
  return;
}

Assistant:

static void InitMaterial(material_t &material) {
  material.name = "";
  material.ambient_texname = "";
  material.diffuse_texname = "";
  material.specular_texname = "";
  material.specular_highlight_texname = "";
  material.bump_texname = "";
  material.displacement_texname = "";
  material.alpha_texname = "";
  for (int i = 0; i < 3; i++) {
    material.ambient[i] = 0.f;
    material.diffuse[i] = 0.f;
    material.specular[i] = 0.f;
    material.transmittance[i] = 0.f;
    material.emission[i] = 0.f;
  }
  material.illum = 0;
  material.dissolve = 1.f;
  material.shininess = 1.f;
  material.ior = 1.f;
  material.unknown_parameter.clear();
}